

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall ON_PolyCurve::RemoveNesting(ON_PolyCurve *this)

{
  ON_SimpleArray<double> *src;
  ON_CurveArray *src_00;
  uint uVar1;
  ON_PolyCurve *poly;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ON_SimpleArray<ON_Curve_*> old_seg;
  ON_SimpleArray<double> old_t;
  ON_SimpleArray<ON_Curve_*> local_70;
  ON_SimpleArray<double> local_58;
  ON_Interval local_40;
  
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  src = &this->m_t;
  local_58._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
  local_58.m_a = (double *)0x0;
  local_58.m_count = 0;
  local_58.m_capacity = 0;
  ON_SimpleArray<double>::operator=(&local_58,src);
  src_00 = &this->m_segment;
  local_70._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080bda0;
  local_70.m_a = (ON_Curve **)0x0;
  local_70.m_count = 0;
  local_70.m_capacity = 0;
  ON_SimpleArray<ON_Curve_*>::operator=(&local_70,&src_00->super_ON_SimpleArray<ON_Curve_*>);
  if (0 < (this->m_t).m_capacity) {
    (this->m_t).m_count = 1;
  }
  if (-1 < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity) {
    (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count = 0;
  }
  if ((int)uVar1 < 1) {
    bVar3 = false;
  }
  else {
    lVar4 = 0;
    bVar3 = false;
    do {
      poly = *(ON_PolyCurve **)((long)local_70.m_a + lVar4);
      if ((poly == (ON_PolyCurve *)0x0) ||
         (bVar2 = ON_Object::IsKindOf((ON_Object *)poly,&m_ON_PolyCurve_class_rtti), !bVar2)) {
        ON_SimpleArray<double>::Append(src,(double *)((long)local_58.m_a + lVar4 + 8));
        ON_SimpleArray<ON_Curve_*>::Append
                  (&src_00->super_ON_SimpleArray<ON_Curve_*>,
                   (ON_Curve **)((long)local_70.m_a + lVar4));
      }
      else {
        ON_Interval::ON_Interval
                  (&local_40,*(double *)((long)local_58.m_a + lVar4),
                   *(double *)((long)local_58.m_a + lVar4 + 8));
        Flatten(poly,local_40,src,&src_00->super_ON_SimpleArray<ON_Curve_*>);
        (*(poly->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(poly);
        bVar3 = true;
      }
      lVar4 = lVar4 + 8;
    } while ((ulong)uVar1 << 3 != lVar4);
  }
  ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&local_70);
  ON_SimpleArray<double>::~ON_SimpleArray(&local_58);
  return bVar3;
}

Assistant:

bool ON_PolyCurve::RemoveNesting( )
{
  bool rc = false;
	int n = Count();

	ON_SimpleArray<double> old_t = m_t;
	ON_SimpleArray<ON_Curve*> old_seg = m_segment;

	m_t.SetCount(1);
	m_segment.SetCount(0);

	for(int i=0; i<n;i++){
		ON_PolyCurve* poly = ON_PolyCurve::Cast( old_seg[i]);
		if(poly){
      rc = true;
			Flatten( poly, ON_Interval(old_t[i], old_t[i+1]), m_t, m_segment );
			delete poly;
		} else {
			m_t.Append( old_t[i+1]); 
			m_segment.Append( old_seg[i] );
		}
	}
  return rc;
}